

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS
ref_metric_gradation_at_complexity_mixed
          (REF_DBL *metric,REF_GRID ref_grid,REF_DBL gradation,REF_DBL complexity)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_GLOB *pRVar3;
  uint uVar4;
  REF_DBL *pRVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  double dVar11;
  REF_DBL current_complexity;
  double local_98;
  double local_90;
  REF_DBL local_88;
  REF_DBL RStack_80;
  REF_DBL *local_70;
  REF_DBL local_68;
  ulong local_60;
  double local_58;
  REF_DBL local_48;
  
  pRVar2 = ref_grid->node;
  if (pRVar2->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x478,
           "ref_metric_gradation_at_complexity_mixed","malloc metric_imply of REF_DBL negative");
    uVar4 = 1;
  }
  else {
    local_90 = *(double *)(&DAT_00212f30 + (ulong)(ref_grid->twod == 0) * 8);
    local_58 = complexity;
    if (complexity <= -complexity) {
      local_58 = -complexity;
    }
    local_70 = metric + 4;
    uVar10 = 0;
    local_88 = 0.0;
    RStack_80 = 1.0;
    local_68 = gradation;
    local_48 = complexity;
    do {
      uVar4 = ref_metric_complexity(metric,ref_grid,&local_98);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x480,"ref_metric_gradation_at_complexity_mixed",(ulong)uVar4,"cmp");
        return uVar4;
      }
      dVar11 = local_98 * 1e+20;
      if (dVar11 <= -dVar11) {
        dVar11 = -dVar11;
      }
      if (dVar11 <= local_58) {
        return 4;
      }
      local_60 = uVar10;
      if (0 < pRVar2->max) {
        lVar8 = 0;
        pRVar5 = metric;
        do {
          if (-1 < pRVar2->global[lVar8]) {
            lVar7 = 0;
            do {
              dVar11 = pow(local_48 / local_98,local_90);
              pRVar5[lVar7] = dVar11 * pRVar5[lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar7 != 6);
            if (ref_grid->twod != 0) {
              metric[lVar8 * 6 + 2] = 0.0;
              metric[lVar8 * 6 + 4] = local_88;
              (metric + lVar8 * 6 + 4)[1] = RStack_80;
            }
          }
          lVar8 = lVar8 + 1;
          pRVar5 = pRVar5 + 6;
        } while (lVar8 < pRVar2->max);
      }
      uVar4 = ref_metric_imply_non_tet(metric,ref_grid);
      if (uVar4 != 0) {
        pcVar9 = "imply non tet";
        uVar6 = 0x48f;
LAB_001d4cf5:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               uVar6,"ref_metric_gradation_at_complexity_mixed",(ulong)uVar4,pcVar9);
        return uVar4;
      }
      if (1.0 <= local_68) {
        uVar4 = ref_metric_metric_space_gradation(metric,ref_grid,local_68);
        if (uVar4 != 0) {
          pcVar9 = "gradation";
          uVar6 = 0x495;
          goto LAB_001d4cf5;
        }
      }
      else {
        uVar4 = ref_metric_mixed_space_gradation(metric,ref_grid,-1.0,-1.0);
        if (uVar4 != 0) {
          pcVar9 = "gradation";
          uVar6 = 0x492;
          goto LAB_001d4cf5;
        }
      }
      if ((ref_grid->twod != 0) && (iVar1 = pRVar2->max, 0 < (long)iVar1)) {
        pRVar3 = pRVar2->global;
        lVar8 = 0;
        pRVar5 = local_70;
        do {
          if (-1 < pRVar3[lVar8]) {
            pRVar5[-2] = 0.0;
            *pRVar5 = local_88;
            pRVar5[1] = RStack_80;
          }
          lVar8 = lVar8 + 1;
          pRVar5 = pRVar5 + 6;
        } while (iVar1 != lVar8);
      }
      uVar4 = (int)local_60 + 1;
      uVar10 = (ulong)uVar4;
    } while (uVar4 != 0x14);
    uVar4 = ref_metric_complexity(metric,ref_grid,&local_98);
    if (uVar4 == 0) {
      dVar11 = local_98 * 1e+20;
      if (dVar11 <= -dVar11) {
        dVar11 = -dVar11;
      }
      uVar4 = 4;
      if (local_58 < dVar11) {
        if (pRVar2->max < 1) {
          uVar4 = 0;
        }
        else {
          lVar8 = 0;
          local_88 = 0.0;
          RStack_80 = 1.0;
          pRVar5 = metric;
          do {
            if (-1 < pRVar2->global[lVar8]) {
              lVar7 = 0;
              do {
                dVar11 = pow(local_48 / local_98,local_90);
                pRVar5[lVar7] = dVar11 * pRVar5[lVar7];
                lVar7 = lVar7 + 1;
              } while (lVar7 != 6);
              if (ref_grid->twod != 0) {
                metric[lVar8 * 6 + 2] = 0.0;
                metric[lVar8 * 6 + 4] = local_88;
                (metric + lVar8 * 6 + 4)[1] = RStack_80;
              }
            }
            lVar8 = lVar8 + 1;
            pRVar5 = pRVar5 + 6;
            uVar4 = 0;
          } while (lVar8 < pRVar2->max);
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x49f,"ref_metric_gradation_at_complexity_mixed",(ulong)uVar4,"cmp");
    }
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_metric_gradation_at_complexity_mixed(
    REF_DBL *metric, REF_GRID ref_grid, REF_DBL gradation, REF_DBL complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT relaxations;
  REF_DBL current_complexity;
  REF_DBL complexity_scale;
  REF_INT node, i;
  REF_DBL *metric_imply;

  ref_malloc(metric_imply, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);

  complexity_scale = 2.0 / 3.0;
  if (ref_grid_twod(ref_grid)) {
    complexity_scale = 1.0;
  }

  for (relaxations = 0; relaxations < 20; relaxations++) {
    RSS(ref_metric_complexity(metric, ref_grid, &current_complexity), "cmp");
    if (!ref_math_divisible(complexity, current_complexity)) {
      return REF_DIV_ZERO;
    }
    each_ref_node_valid_node(ref_node, node) {
      for (i = 0; i < 6; i++) {
        metric[i + 6 * node] *=
            pow(complexity / current_complexity, complexity_scale);
      }
      if (ref_grid_twod(ref_grid)) {
        metric[2 + 6 * node] = 0.0;
        metric[4 + 6 * node] = 0.0;
        metric[5 + 6 * node] = 1.0;
      }
    }
    RSS(ref_metric_imply_non_tet(metric, ref_grid), "imply non tet");
    if (gradation < 1.0) {
      RSS(ref_metric_mixed_space_gradation(metric, ref_grid, -1.0, -1.0),
          "gradation");
    } else {
      RSS(ref_metric_metric_space_gradation(metric, ref_grid, gradation),
          "gradation");
    }
    if (ref_grid_twod(ref_grid)) {
      each_ref_node_valid_node(ref_node, node) {
        metric[2 + 6 * node] = 0.0;
        metric[4 + 6 * node] = 0.0;
        metric[5 + 6 * node] = 1.0;
      }
    }
  }
  RSS(ref_metric_complexity(metric, ref_grid, &current_complexity), "cmp");
  if (!ref_math_divisible(complexity, current_complexity)) {
    return REF_DIV_ZERO;
  }
  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] *=
          pow(complexity / current_complexity, complexity_scale);
    }
    if (ref_grid_twod(ref_grid)) {
      metric[2 + 6 * node] = 0.0;
      metric[4 + 6 * node] = 0.0;
      metric[5 + 6 * node] = 1.0;
    }
  }

  ref_free(metric_imply) return REF_SUCCESS;
}